

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gzio.c
# Opt level: O0

int cm_zlib_gzeof(gzFile file)

{
  gz_stream *s;
  gzFile file_local;
  
  if ((file == (gzFile)0x0) || (*(char *)((long)file + 0xac) != 'r')) {
    file_local._4_4_ = 0;
  }
  else if (*(int *)((long)file + 0x74) == 0) {
    file_local._4_4_ = (uint)(*(int *)((long)file + 0x70) == 1);
  }
  else {
    file_local._4_4_ = 1;
  }
  return file_local._4_4_;
}

Assistant:

int ZEXPORT gzeof (file)
    gzFile file;
{
    gz_stream *s = (gz_stream*)file;

    /* With concatenated compressed files that can have embedded
     * crc trailers, z_eof is no longer the only/best indicator of EOF
     * on a gz_stream. Handle end-of-stream error explicitly here.
     */
    if (s == NULL || s->mode != 'r') return 0;
    if (s->z_eof) return 1;
    return s->z_err == Z_STREAM_END;
}